

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::json_abi_v3_11_3::detail::concat<std::__cxx11::string,char_const(&)[25],char_const*>
          (char (*args) [25],char **args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  char (*in_stack_ffffffffffffffb8) [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffffd0);
  concat_length<char_const*>((char *)in_RDI,(char **)in_stack_ffffffffffffffb8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[25],_const_char_*,_0>
            (in_RDI,in_stack_ffffffffffffffb8,(char **)0x6808bc);
  return in_RDI;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}